

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O2

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::~EigenDecompositionSquare
          (EigenDecompositionSquare<float,_1> *this)

{
  int i;
  long lVar1;
  
  (this->super_EigenDecomposition<float,_1>)._vptr_EigenDecomposition =
       (_func_int **)&PTR__EigenDecompositionSquare_00159748;
  for (lVar1 = 0; lVar1 < (this->super_EigenDecomposition<float,_1>).kEigenDecompCount;
      lVar1 = lVar1 + 1) {
    free(this->gEMatrices[lVar1]);
    free(this->gIMatrices[lVar1]);
    free((this->super_EigenDecomposition<float,_1>).gEigenValues[lVar1]);
  }
  free(this->gEMatrices);
  free(this->gIMatrices);
  free((this->super_EigenDecomposition<float,_1>).gEigenValues);
  free((this->super_EigenDecomposition<float,_1>).matrixTmp);
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::~EigenDecompositionSquare() {

	for(int i=0; i<kEigenDecompCount; i++) {
		free(gEMatrices[i]);
		free(gIMatrices[i]);
		free(gEigenValues[i]);
	}
	free(gEMatrices);
	free(gIMatrices);
	free(gEigenValues);
	free(matrixTmp);
}